

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

bool despot::option::Parser::streq(char *st1,char *st2)

{
  char cVar1;
  char cVar2;
  bool local_21;
  char *local_20;
  char *st2_local;
  char *st1_local;
  
  local_20 = st2;
  st2_local = st1;
  do {
    if (*st2_local == '\0') {
      local_21 = true;
      if (*local_20 != '\0') {
        local_21 = *local_20 == '=';
      }
      return local_21;
    }
    cVar1 = *st2_local;
    cVar2 = *local_20;
    local_20 = local_20 + 1;
    st2_local = st2_local + 1;
  } while (cVar1 == cVar2);
  return false;
}

Assistant:

static bool streq(const char* st1, const char* st2) {
		while (*st1 != 0)
			if (*st1++ != *st2++)
				return false;
		return (*st2 == 0 || *st2 == '=');
	}